

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void wiz_hack_map_query_feature(chunk *c,void *closure,loc grid,_Bool *show,uint8_t *color)

{
  long lVar1;
  uint8_t uVar2;
  _Bool _Var3;
  square *psVar4;
  long lVar5;
  
  psVar4 = square((chunk_conflict *)c,grid);
  lVar5 = 0;
  do {
    if (*(int *)((long)closure + 8) <= lVar5) {
      *show = false;
      return;
    }
    lVar1 = lVar5 * 4;
    lVar5 = lVar5 + 1;
  } while (*(uint *)(*closure + lVar1) != (uint)psVar4->feat);
  *show = true;
  _Var3 = square_ispassable((chunk_conflict *)c,grid);
  uVar2 = '\x04';
  if (_Var3) {
    uVar2 = '\v';
  }
  *color = uVar2;
  return;
}

Assistant:

static void wiz_hack_map_query_feature(struct chunk *c, void *closure,
	struct loc grid, bool *show, uint8_t *color)
{
	const struct wiz_query_feature_closure *sel_feats = closure;
	int i = 0;
	int sq_feat = square(c, grid)->feat;

	while (1) {
		if (i >= sel_feats->n) {
			*show = false;
			return;
		}
		if (sq_feat == sel_feats->features[i]) {
			*show = true;
			*color = (square_ispassable(c, grid)) ?
				COLOUR_YELLOW : COLOUR_RED;
			return;
		}
		++i;
	}
}